

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::compute::anon_unknown_1::IndirectDispatchInstanceBufferUpload::iterate
          (TestStatus *__return_storage_ptr__,IndirectDispatchInstanceBufferUpload *this)

{
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  Allocator *pAVar3;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar4;
  VkDescriptorPool descriptorPool_00;
  VkQueue queue;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)19>_> data_00;
  RefData<vk::Handle<(vk::HandleType)16>_> data_01;
  RefData<vk::Handle<(vk::HandleType)18>_> data_02;
  RefData<vk::Handle<(vk::HandleType)21>_> data_03;
  RefData<vk::Handle<(vk::HandleType)24>_> data_04;
  RefData<vk::VkCommandBuffer_s_*> data_05;
  RefData<vk::Handle<(vk::HandleType)22>_> data_06;
  deBool dVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  ulong uVar8;
  size_type sVar9;
  const_reference pvVar10;
  InstanceInterface *instance_interface;
  VkPhysicalDevice physicalDevice;
  VkDeviceSize resultBlockSize_00;
  Allocation *this_00;
  void *pvVar11;
  uint *puVar12;
  uint *puVar13;
  VkDeviceSize offset;
  ProgramCollection<vk::ProgramBinary> *this_01;
  ProgramBinary *binary;
  Handle<(vk::HandleType)19> *pHVar14;
  Handle<(vk::HandleType)16> *pHVar15;
  Handle<(vk::HandleType)14> *pHVar16;
  DescriptorPoolBuilder *this_02;
  VkBuffer *pVVar17;
  Handle<(vk::HandleType)24> *pHVar18;
  VkCommandBuffer_s **ppVVar19;
  Handle<(vk::HandleType)18> *pHVar20;
  Unique<vk::Handle<(vk::HandleType)22>_> *this_03;
  Handle<(vk::HandleType)21> *pHVar21;
  reference pvVar22;
  RefBase<vk::Handle<(vk::HandleType)22>_> *pRVar23;
  Handle<(vk::HandleType)22> *pHVar24;
  allocator<char> local_9f9;
  string local_9f8;
  undefined4 local_9d8;
  allocator<char> local_9d1;
  string local_9d0;
  deUint64 local_9b0;
  deUint64 local_9a8;
  Location local_9a0;
  VkDescriptorSet local_998;
  undefined1 local_990 [8];
  DescriptorSetUpdateBuilder descriptorSetBuilder;
  undefined1 local_940 [8];
  VkDescriptorBufferInfo resultDescriptorInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_910;
  RefData<vk::Handle<(vk::HandleType)22>_> local_8f0;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> local_8d0;
  uint local_8bc;
  VkDeviceSize VStack_8b8;
  deUint32 cmdNdx_2;
  VkDeviceSize curOffset;
  undefined1 local_8a8 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  descriptorSets;
  VkBufferCreateInfo local_880;
  undefined1 local_848 [8];
  Buffer indirectBuffer;
  Move<vk::VkCommandBuffer_s_*> local_810;
  RefData<vk::VkCommandBuffer_s_*> local_7f0;
  undefined1 local_7d0 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_790;
  undefined1 local_770 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  undefined1 local_748 [8];
  VkBufferMemoryBarrier ssboPostBarrier;
  Move<vk::Handle<(vk::HandleType)21>_> local_6f8;
  RefData<vk::Handle<(vk::HandleType)21>_> local_6d8;
  undefined1 local_6b8 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)18>_> local_688;
  RefData<vk::Handle<(vk::HandleType)18>_> local_668;
  undefined1 local_648 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> computePipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_620;
  RefData<vk::Handle<(vk::HandleType)16>_> local_600;
  undefined1 local_5e0 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  RefData<vk::Handle<(vk::HandleType)19>_> local_5a0;
  undefined1 local_580 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  DescriptorSetLayoutBuilder layoutBuilder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  Move<vk::Handle<(vk::HandleType)14>_> local_4d8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_4b8;
  undefined1 local_498 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> verifyShader;
  deUint8 *dstPtr;
  deUint32 cmdNdx_1;
  deUint8 *resultDataPtr;
  Allocation *alloc;
  VkBufferCreateInfo local_448;
  undefined1 local_410 [8];
  Buffer resultBuffer;
  VkDeviceSize resultBufferSize;
  VkDeviceSize resultBlockSize;
  uint local_24c;
  size_type sStack_248;
  deUint32 cmdNdx;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  allocator<char> local_1d9;
  string local_1d8;
  ScopedLogSection local_1b8;
  ScopedLogSection section;
  MessageBuilder local_1a0;
  TestContext *local_20;
  TestContext *testCtx;
  IndirectDispatchInstanceBufferUpload *this_local;
  
  testCtx = (TestContext *)this;
  this_local = (IndirectDispatchInstanceBufferUpload *)__return_storage_ptr__;
  local_20 = Context::getTestContext(this->m_context);
  pTVar6 = tcu::TestContext::getLog(local_20);
  tcu::TestLog::operator<<(&local_1a0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_1a0,(char (*) [36])"GL_DISPATCH_INDIRECT_BUFFER size = ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_bufferSize);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  pTVar6 = tcu::TestContext::getLog(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"Commands",&local_1d9);
  sStack_248 = std::
               vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
               ::size(&this->m_dispatchCommands);
  de::toString<unsigned_long>(&local_240,&stack0xfffffffffffffdb8);
  std::operator+(&local_220,"Indirect Dispatch Commands (",&local_240);
  std::operator+(&local_200,&local_220," in total)");
  tcu::ScopedLogSection::ScopedLogSection(&local_1b8,pTVar6,&local_1d8,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  local_24c = 0;
  while( true ) {
    uVar8 = (ulong)local_24c;
    sVar9 = std::
            vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
            ::size(&this->m_dispatchCommands);
    if (sVar9 <= uVar8) break;
    pTVar6 = tcu::TestContext::getLog(local_20);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&resultBlockSize,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message
              );
    pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)&resultBlockSize,&local_24c);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x134fa06);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [10])0x13707bf);
    pvVar10 = std::
              vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
              ::operator[](&this->m_dispatchCommands,(ulong)local_24c);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&pvVar10->m_offset);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [19])", numWorkGroups = ");
    pvVar10 = std::
              vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
              ::operator[](&this->m_dispatchCommands,(ulong)local_24c);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&pvVar10->m_numWorkGroups);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&resultBlockSize);
    local_24c = local_24c + 1;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_1b8);
  instance_interface = Context::getInstanceInterface(this->m_context);
  physicalDevice = Context::getPhysicalDevice(this->m_context);
  resultBlockSize_00 = getResultBlockAlignedSize(instance_interface,physicalDevice,0x10);
  sVar9 = std::
          vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
          ::size(&this->m_dispatchCommands);
  resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)(resultBlockSize_00 * (sVar9 & 0xffffffff));
  pDVar1 = this->m_device_interface;
  pVVar2 = this->m_device;
  pAVar3 = this->m_allocator;
  makeBufferCreateInfo
            (&local_448,
             (VkDeviceSize)
             resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,0x20);
  compute::Buffer::Buffer
            ((Buffer *)local_410,pDVar1,pVVar2,pAVar3,&local_448,
             ::vk::MemoryRequirement::HostVisible);
  this_00 = compute::Buffer::getAllocation((Buffer *)local_410);
  pvVar11 = ::vk::Allocation::getHostPtr(this_00);
  dstPtr._4_4_ = 0;
  while( true ) {
    sVar9 = std::
            vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
            ::size(&this->m_dispatchCommands);
    if (sVar9 <= dstPtr._4_4_) break;
    puVar12 = (uint *)((long)pvVar11 + resultBlockSize_00 * dstPtr._4_4_);
    pvVar10 = std::
              vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
              ::operator[](&this->m_dispatchCommands,(ulong)dstPtr._4_4_);
    puVar13 = tcu::Vector<unsigned_int,_3>::operator[](&pvVar10->m_numWorkGroups,0);
    *puVar12 = *puVar13;
    pvVar10 = std::
              vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
              ::operator[](&this->m_dispatchCommands,(ulong)dstPtr._4_4_);
    puVar13 = tcu::Vector<unsigned_int,_3>::operator[](&pvVar10->m_numWorkGroups,1);
    puVar12[1] = *puVar13;
    pvVar10 = std::
              vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
              ::operator[](&this->m_dispatchCommands,(ulong)dstPtr._4_4_);
    puVar13 = tcu::Vector<unsigned_int,_3>::operator[](&pvVar10->m_numWorkGroups,2);
    puVar12[2] = *puVar13;
    puVar12[3] = 0;
    dstPtr._4_4_ = dstPtr._4_4_ + 1;
  }
  pDVar1 = this->m_device_interface;
  pVVar2 = this->m_device;
  verifyShader.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(this_00);
  offset = ::vk::Allocation::getOffset(this_00);
  ::vk::flushMappedMemoryRange
            (pDVar1,pVVar2,
             (VkDeviceMemory)
             verifyShader.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator,
             offset,(VkDeviceSize)
                    resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                    deleter.m_allocator);
  pDVar1 = this->m_device_interface;
  pVVar2 = this->m_device;
  this_01 = Context::getBinaryCollection(this->m_context);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &layoutBuilder.m_immutableSamplers.
                  super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"indirect_dispatch_",
                 &this->m_name);
  std::operator+(&local_4f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &layoutBuilder.m_immutableSamplers.
                  super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"_verify");
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_01,&local_4f8);
  ::vk::createShaderModule(&local_4d8,pDVar1,pVVar2,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4b8,(Move *)&local_4d8);
  data.deleter.m_deviceIface._0_4_ = (int)local_4b8.deleter.m_deviceIface;
  data.object.m_internal = local_4b8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4b8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_4b8.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_4b8.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_4b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_498,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_4d8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string
            ((string *)
             &layoutBuilder.m_immutableSamplers.
              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorSetLayoutBuilder::addSingleBinding
            ((DescriptorSetLayoutBuilder *)
             &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
              m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator,
             (DescriptorSetLayoutBuilder *)
             &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
              m_allocator,this->m_device_interface,this->m_device,0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_5a0,
             (Move *)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                      m_allocator);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_5a0.deleter.m_deviceIface;
  data_00.object.m_internal = local_5a0.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5a0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_5a0.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_5a0.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_5a0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_580,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator);
  pDVar1 = this->m_device_interface;
  pVVar2 = this->m_device;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_580);
  computePipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar14->m_internal;
  makePipelineLayout(&local_620,pDVar1,pVVar2,
                     (VkDescriptorSetLayout)
                     computePipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_600,(Move *)&local_620);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_600.deleter.m_deviceIface;
  data_01.object.m_internal = local_600.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_600.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_600.deleter.m_device;
  data_01.deleter.m_allocator._0_4_ = (int)local_600.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_600.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_5e0,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_620);
  pDVar1 = this->m_device_interface;
  pVVar2 = this->m_device;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_5e0);
  pipelineLayout_00.m_internal = pHVar15->m_internal;
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_498);
  descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar16->m_internal;
  makeComputePipeline(&local_688,pDVar1,pVVar2,pipelineLayout_00,
                      (VkShaderModule)
                      descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                      m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_668,(Move *)&local_688);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_668.deleter.m_deviceIface;
  data_02.object.m_internal = local_668.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_668.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_668.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_668.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_668.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_648,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_688);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&ssboPostBarrier.size)
  ;
  sVar9 = std::
          vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
          ::size(&this->m_dispatchCommands);
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&ssboPostBarrier.size,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,(deUint32)sVar9);
  pDVar1 = this->m_device_interface;
  pVVar2 = this->m_device;
  sVar9 = std::
          vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
          ::size(&this->m_dispatchCommands);
  ::vk::DescriptorPoolBuilder::build(&local_6f8,this_02,pDVar1,pVVar2,1,(deUint32)sVar9);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_6d8,(Move *)&local_6f8);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_6d8.deleter.m_deviceIface;
  data_03.object.m_internal = local_6d8.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_6d8.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_6d8.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_6d8.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_6d8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_6b8,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_6f8);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)&ssboPostBarrier.size);
  pVVar17 = compute::Buffer::operator*((Buffer *)local_410);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pVVar17->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_748,0x40,0x2000,
             (VkBuffer)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,0,
             (VkDeviceSize)
             resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                  this->m_device_interface,this->m_device,this->m_queueFamilyIndex);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_790,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_790.deleter.m_deviceIface;
  data_04.object.m_internal = local_790.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_790.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device = local_790.deleter.m_device;
  data_04.deleter.m_allocator._0_4_ = (int)local_790.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_790.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_770,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pDVar1 = this->m_device_interface;
  pVVar2 = this->m_device;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_770);
  indirectBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar18->m_internal;
  ::vk::allocateCommandBuffer
            (&local_810,pDVar1,pVVar2,
             (VkCommandPool)
             indirectBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_7f0,(Move *)&local_810);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_7f0.deleter.m_deviceIface;
  data_05.object = local_7f0.object;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_7f0.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device = local_7f0.deleter.m_device;
  data_05.deleter.m_pool.m_internal._0_4_ = (int)local_7f0.deleter.m_pool.m_internal;
  data_05.deleter.m_pool.m_internal._4_4_ = (int)(local_7f0.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_7d0,data_05);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_810);
  pDVar1 = this->m_device_interface;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7d0);
  beginCommandBuffer(pDVar1,*ppVVar19);
  pDVar1 = this->m_device_interface;
  pVVar2 = this->m_device;
  pAVar3 = this->m_allocator;
  makeBufferCreateInfo(&local_880,this->m_bufferSize,0x120);
  compute::Buffer::Buffer
            ((Buffer *)local_848,pDVar1,pVVar2,pAVar3,&local_880,
             ::vk::MemoryRequirement::HostVisible);
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7d0);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(this,*ppVVar19,local_848);
  pDVar1 = this->m_device_interface;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7d0);
  pVVar4 = *ppVVar19;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_648);
  descriptorSets.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar20->m_internal;
  (*pDVar1->_vptr_DeviceInterface[0x4c])
            (pDVar1,pVVar4,1,
             descriptorSets.
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar9 = std::
          vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
          ::size(&this->m_dispatchCommands);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>::
  allocator((allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_> *)
            ((long)&curOffset + 7));
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
            *)local_8a8,sVar9,
           (allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_> *)
           ((long)&curOffset + 7));
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>::
  ~allocator((allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_> *)
             ((long)&curOffset + 7));
  VStack_8b8 = 0;
  local_8bc = 0;
  while( true ) {
    uVar8 = (ulong)local_8bc;
    sVar9 = std::
            vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
            ::size(&this->m_dispatchCommands);
    if (sVar9 <= uVar8) break;
    this_03 = (Unique<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
    resultDescriptorInfo.range._7_1_ = 1;
    pDVar1 = this->m_device_interface;
    pVVar2 = this->m_device;
    pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_6b8);
    descriptorPool_00.m_internal = pHVar21->m_internal;
    pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_580);
    makeDescriptorSet(&local_910,pDVar1,pVVar2,descriptorPool_00,
                      (VkDescriptorSetLayout)pHVar14->m_internal);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_8f0,(Move *)&local_910);
    data_06.deleter.m_deviceIface._0_4_ = (int)local_8f0.deleter.m_deviceIface;
    data_06.object.m_internal = local_8f0.object.m_internal;
    data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_8f0.deleter.m_deviceIface >> 0x20);
    data_06.deleter.m_device = local_8f0.deleter.m_device;
    data_06.deleter.m_pool.m_internal._0_4_ = (int)local_8f0.deleter.m_pool.m_internal;
    data_06.deleter.m_pool.m_internal._4_4_ = (int)(local_8f0.deleter.m_pool.m_internal >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique(this_03,data_06);
    resultDescriptorInfo.range._7_1_ = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::SharedPtr
              (&local_8d0,this_03);
    pvVar22 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                            *)local_8a8,(ulong)local_8bc);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
              (pvVar22,&local_8d0);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr(&local_8d0);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_910);
    pVVar17 = compute::Buffer::operator*((Buffer *)local_410);
    descriptorSetBuilder.m_copies.
    super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pVVar17->m_internal;
    ::vk::makeDescriptorBufferInfo
              ((VkDescriptorBufferInfo *)local_940,
               (VkBuffer)
               descriptorSetBuilder.m_copies.
               super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,VStack_8b8,resultBlockSize_00);
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)local_990);
    pvVar22 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                            *)local_8a8,(ulong)local_8bc);
    pRVar23 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator*
                         (pvVar22)->super_RefBase<vk::Handle<(vk::HandleType)22>_>;
    pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*(pRVar23);
    local_998.m_internal = pHVar24->m_internal;
    local_9a0 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              ((DescriptorSetUpdateBuilder *)local_990,local_998,&local_9a0,
               VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,(VkDescriptorBufferInfo *)local_940);
    ::vk::DescriptorSetUpdateBuilder::update
              ((DescriptorSetUpdateBuilder *)local_990,this->m_device_interface,this->m_device);
    pDVar1 = this->m_device_interface;
    ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_7d0);
    pVVar4 = *ppVVar19;
    pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_5e0);
    local_9a8 = pHVar15->m_internal;
    pvVar22 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                            *)local_8a8,(ulong)local_8bc);
    pRVar23 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator*
                         (pvVar22)->super_RefBase<vk::Handle<(vk::HandleType)22>_>;
    pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*(pRVar23);
    (*pDVar1->_vptr_DeviceInterface[0x56])(pDVar1,pVVar4,1,local_9a8,0,1,pHVar24,0,0);
    pDVar1 = this->m_device_interface;
    ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_7d0);
    pVVar4 = *ppVVar19;
    pVVar17 = compute::Buffer::operator*((Buffer *)local_848);
    local_9b0 = pVVar17->m_internal;
    pvVar10 = std::
              vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
              ::operator[](&this->m_dispatchCommands,(ulong)local_8bc);
    (*pDVar1->_vptr_DeviceInterface[0x5e])(pDVar1,pVVar4,local_9b0,pvVar10->m_offset);
    VStack_8b8 = resultBlockSize_00 + VStack_8b8;
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)local_990);
    local_8bc = local_8bc + 1;
  }
  pDVar1 = this->m_device_interface;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7d0);
  (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,*ppVVar19,0x800,0x4000,0,0,0,1,local_748,0,0);
  pDVar1 = this->m_device_interface;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7d0);
  endCommandBuffer(pDVar1,*ppVVar19);
  pDVar1 = this->m_device_interface;
  pVVar2 = this->m_device;
  queue = this->m_queue;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7d0);
  submitCommandsAndWait(pDVar1,pVVar2,queue,*ppVVar19);
  dVar5 = verifyResultBuffer(this,(Buffer *)local_410,resultBlockSize_00,
                             (VkDeviceSize)
                             resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                             m_data.deleter.m_allocator);
  if (dVar5 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9f8,"Invalid values in result buffer",&local_9f9);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_9f8);
    std::__cxx11::string::~string((string *)&local_9f8);
    std::allocator<char>::~allocator(&local_9f9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d0,"Pass",&local_9d1);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_9d0);
    std::__cxx11::string::~string((string *)&local_9d0);
    std::allocator<char>::~allocator(&local_9d1);
  }
  local_9d8 = 1;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
             *)local_8a8);
  compute::Buffer::~Buffer((Buffer *)local_848);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_7d0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_770);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_6b8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_648);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_5e0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_580);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
              m_allocator);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_498);
  compute::Buffer::~Buffer((Buffer *)local_410);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus IndirectDispatchInstanceBufferUpload::iterate (void)
{
	tcu::TestContext& testCtx = m_context.getTestContext();

	testCtx.getLog() << tcu::TestLog::Message << "GL_DISPATCH_INDIRECT_BUFFER size = " << m_bufferSize << tcu::TestLog::EndMessage;
	{
		tcu::ScopedLogSection section(testCtx.getLog(), "Commands", "Indirect Dispatch Commands (" + de::toString(m_dispatchCommands.size()) + " in total)");

		for (deUint32 cmdNdx = 0; cmdNdx < m_dispatchCommands.size(); ++cmdNdx)
		{
			testCtx.getLog()
				<< tcu::TestLog::Message
				<< cmdNdx << ": " << "offset = " << m_dispatchCommands[cmdNdx].m_offset << ", numWorkGroups = " << m_dispatchCommands[cmdNdx].m_numWorkGroups
				<< tcu::TestLog::EndMessage;
		}
	}

	// Create result buffer
	const vk::VkDeviceSize resultBlockSize = getResultBlockAlignedSize(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), RESULT_BLOCK_BASE_SIZE);
	const vk::VkDeviceSize resultBufferSize = resultBlockSize * (deUint32)m_dispatchCommands.size();

	Buffer resultBuffer(
		m_device_interface, m_device, m_allocator,
		makeBufferCreateInfo(resultBufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
		vk::MemoryRequirement::HostVisible);

	{
		const vk::Allocation& alloc = resultBuffer.getAllocation();
		deUint8* resultDataPtr = reinterpret_cast<deUint8*>(alloc.getHostPtr());

		for (deUint32 cmdNdx = 0; cmdNdx < m_dispatchCommands.size(); ++cmdNdx)
		{
			deUint8* const	dstPtr = &resultDataPtr[resultBlockSize*cmdNdx];

			*(deUint32*)(dstPtr + 0 * sizeof(deUint32)) = m_dispatchCommands[cmdNdx].m_numWorkGroups[0];
			*(deUint32*)(dstPtr + 1 * sizeof(deUint32)) = m_dispatchCommands[cmdNdx].m_numWorkGroups[1];
			*(deUint32*)(dstPtr + 2 * sizeof(deUint32)) = m_dispatchCommands[cmdNdx].m_numWorkGroups[2];
			*(deUint32*)(dstPtr + RESULT_BLOCK_NUM_PASSED_OFFSET) = 0;
		}

		vk::flushMappedMemoryRange(m_device_interface, m_device, alloc.getMemory(), alloc.getOffset(), resultBufferSize);
	}

	// Create verify compute shader
	const vk::Unique<vk::VkShaderModule> verifyShader(createShaderModule(
		m_device_interface, m_device, m_context.getBinaryCollection().get("indirect_dispatch_" + m_name + "_verify"), 0u));

	// Create descriptorSetLayout
	vk::DescriptorSetLayoutBuilder layoutBuilder;
	layoutBuilder.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, vk::VK_SHADER_STAGE_COMPUTE_BIT);
	vk::Unique<vk::VkDescriptorSetLayout> descriptorSetLayout(layoutBuilder.build(m_device_interface, m_device));

	// Create compute pipeline
	const vk::Unique<vk::VkPipelineLayout> pipelineLayout(makePipelineLayout(m_device_interface, m_device, *descriptorSetLayout));
	const vk::Unique<vk::VkPipeline> computePipeline(makeComputePipeline(m_device_interface, m_device, *pipelineLayout, *verifyShader));

	// Create descriptor pool
	const vk::Unique<vk::VkDescriptorPool> descriptorPool(
		vk::DescriptorPoolBuilder()
		.addType(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, (deUint32)m_dispatchCommands.size())
		.build(m_device_interface, m_device, vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, static_cast<deUint32>(m_dispatchCommands.size())));

	const vk::VkBufferMemoryBarrier ssboPostBarrier = makeBufferMemoryBarrier(
		vk::VK_ACCESS_SHADER_WRITE_BIT, vk::VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSize);

	// Create command buffer
	const vk::Unique<vk::VkCommandPool> cmdPool(makeCommandPool(m_device_interface, m_device, m_queueFamilyIndex));
	const vk::Unique<vk::VkCommandBuffer> cmdBuffer(allocateCommandBuffer(m_device_interface, m_device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Begin recording commands
	beginCommandBuffer(m_device_interface, *cmdBuffer);

	// Create indirect buffer
	Buffer indirectBuffer(
		m_device_interface, m_device, m_allocator,
		makeBufferCreateInfo(m_bufferSize, vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT | vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
		vk::MemoryRequirement::HostVisible);
	fillIndirectBufferData(*cmdBuffer, indirectBuffer);

	// Bind compute pipeline
	m_device_interface.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);

	// Allocate descriptor sets
	typedef de::SharedPtr<vk::Unique<vk::VkDescriptorSet> > SharedVkDescriptorSet;
	std::vector<SharedVkDescriptorSet> descriptorSets(m_dispatchCommands.size());

	vk::VkDeviceSize curOffset = 0;

	// Create descriptor sets
	for (deUint32 cmdNdx = 0; cmdNdx < m_dispatchCommands.size(); ++cmdNdx)
	{
		descriptorSets[cmdNdx] = SharedVkDescriptorSet(new vk::Unique<vk::VkDescriptorSet>(
									makeDescriptorSet(m_device_interface, m_device, *descriptorPool, *descriptorSetLayout)));

		const vk::VkDescriptorBufferInfo resultDescriptorInfo = makeDescriptorBufferInfo(*resultBuffer, curOffset, resultBlockSize);

		vk::DescriptorSetUpdateBuilder descriptorSetBuilder;
		descriptorSetBuilder.writeSingle(**descriptorSets[cmdNdx], vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultDescriptorInfo);
		descriptorSetBuilder.update(m_device_interface, m_device);

		// Bind descriptor set
		m_device_interface.cmdBindDescriptorSets(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &(**descriptorSets[cmdNdx]), 0u, DE_NULL);

		// Dispatch indirect compute command
		m_device_interface.cmdDispatchIndirect(*cmdBuffer, *indirectBuffer, m_dispatchCommands[cmdNdx].m_offset);

		curOffset += resultBlockSize;
	}

	// Insert memory barrier
	m_device_interface.cmdPipelineBarrier(*cmdBuffer, vk::VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0,
										  0, (const vk::VkMemoryBarrier*)DE_NULL,
										  1, &ssboPostBarrier,
										  0, (const vk::VkImageMemoryBarrier*)DE_NULL);

	// End recording commands
	endCommandBuffer(m_device_interface, *cmdBuffer);

	// Wait for command buffer execution finish
	submitCommandsAndWait(m_device_interface, m_device, m_queue, *cmdBuffer);

	// Check if result buffer contains valid values
	if (verifyResultBuffer(resultBuffer, resultBlockSize, resultBufferSize))
		return tcu::TestStatus(QP_TEST_RESULT_PASS, "Pass");
	else
		return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Invalid values in result buffer");
}